

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Estimate<double> *
Catch::Benchmark::Detail::bootstrap
          (double confidence_level,double *first,double *last,sample *resample,
          _func_double_double_ptr_double_ptr *estimator)

{
  bool bVar1;
  double *first_00;
  double *pdVar2;
  size_type sVar3;
  reference pdVar4;
  difference_type dVar5;
  size_type *psVar6;
  const_reference pvVar7;
  vector<double,_std::allocator<double>_> *in_RCX;
  long in_RDX;
  long in_RSI;
  Estimate<double> *in_RDI;
  code *in_R8;
  double in_XMM0_Qa;
  double dVar8;
  size_t hi;
  size_t lo;
  double a2;
  double a1;
  double b2;
  double b1;
  anon_class_16_2_f681591a a;
  anon_class_8_1_54a3980e cumn;
  double z1;
  double bias;
  double prob_n;
  long n;
  double accel;
  double cube;
  double square;
  double difference;
  double x;
  iterator __end2;
  iterator __begin2;
  sample *__range2;
  double sum_cubes;
  double sum_squares;
  double jack_mean;
  sample jack;
  double point;
  long n_samples;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffe30;
  anon_class_8_1_a87844b0_for__M_pred in_stack_fffffffffffffe40;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe48;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe50;
  double *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  _func_double_double_ptr_double_ptr *in_stack_fffffffffffffe78;
  double dVar9;
  long local_158;
  long local_150;
  size_type local_148;
  long local_140;
  long local_138;
  pointer local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  anon_class_16_2_f681591a local_108;
  size_type local_f8;
  double local_f0;
  double local_e8;
  undefined4 local_e0;
  double local_d0;
  double *local_c8;
  double *local_c0;
  double local_b8;
  size_type local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double *local_80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_78;
  vector<double,_std::allocator<double>_> *local_70;
  double local_68;
  double local_60;
  double local_58;
  vector<double,_std::allocator<double>_> local_50;
  double local_38;
  long local_30;
  vector<double,_std::allocator<double>_> *local_20;
  double local_8;
  
  local_30 = in_RDX - in_RSI >> 3;
  local_20 = in_RCX;
  local_8 = in_XMM0_Qa;
  local_38 = (double)(*in_R8)(in_RSI,in_RDX);
  if (local_30 == 1) {
    in_RDI->point = local_38;
    in_RDI->lower_bound = local_38;
    in_RDI->upper_bound = local_38;
    in_RDI->confidence_interval = local_8;
  }
  else {
    anon_unknown_13::jackknife
              (in_stack_fffffffffffffe78,
               (double *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    first_00 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x175aaa);
    pdVar2 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x175abc);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_50);
    local_58 = mean(first_00,pdVar2 + sVar3);
    local_60 = 0.0;
    local_68 = 0.0;
    local_70 = &local_50;
    local_78._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe28);
    local_80 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe28);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffe30,
                         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_fffffffffffffe28);
      if (!bVar1) break;
      pdVar4 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_78);
      local_88 = *pdVar4;
      local_90 = local_58 - local_88;
      local_98 = local_90 * local_90;
      local_a0 = local_98 * local_90;
      local_60 = local_98 + local_60;
      local_68 = local_a0 + local_68;
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_78);
    }
    dVar9 = local_68;
    dVar8 = pow(local_60,1.5);
    local_a8 = dVar9 / (dVar8 * 6.0);
    local_b0 = std::vector<double,_std::allocator<double>_>::size(local_20);
    local_c0 = (double *)
               std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffe28);
    local_c8 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffe28);
    local_d0 = local_38;
    dVar5 = std::
            count_if<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,Catch::Benchmark::Detail::bootstrap(double,double*,double*,std::vector<double,std::allocator<double>>const&,double(*)(double_const*,double_const*))::__0>
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40
                      );
    local_b8 = (double)dVar5 / (double)(long)local_b0;
    bVar1 = Catch::Detail::directCompare(local_b8,0.0);
    if (bVar1) {
      in_RDI->point = local_38;
      in_RDI->lower_bound = local_38;
      in_RDI->upper_bound = local_38;
      in_RDI->confidence_interval = local_8;
    }
    else {
      local_e8 = normal_quantile((double)in_stack_fffffffffffffe28);
      local_f0 = normal_quantile((double)in_stack_fffffffffffffe28);
      local_f8 = local_b0;
      local_108.bias = local_e8;
      local_108.accel = local_a8;
      local_110 = local_e8 + local_f0;
      local_118 = local_e8 - local_f0;
      local_120 = bootstrap::anon_class_16_2_f681591a::operator()(&local_108,local_110);
      local_128 = bootstrap::anon_class_16_2_f681591a::operator()(&local_108,local_118);
      local_138 = bootstrap::anon_class_8_1_54a3980e::operator()
                            ((anon_class_8_1_54a3980e *)in_stack_fffffffffffffe30,
                             (double)in_stack_fffffffffffffe28);
      local_140 = 0;
      in_stack_fffffffffffffe40.point = (double)std::max<long>(&local_138,&local_140);
      local_130 = (((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe40.point)->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      local_150 = bootstrap::anon_class_8_1_54a3980e::operator()
                            ((anon_class_8_1_54a3980e *)in_stack_fffffffffffffe30,
                             (double)in_stack_fffffffffffffe28);
      local_158 = local_b0 - 1;
      psVar6 = (size_type *)std::min<long>(&local_150,&local_158);
      local_148 = *psVar6;
      in_RDI->point = local_38;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_20,(size_type)local_130);
      in_RDI->lower_bound = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_20,local_148);
      in_RDI->upper_bound = *pvVar7;
      in_RDI->confidence_interval = local_8;
    }
    local_e0 = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe40.point);
  }
  return in_RDI;
}

Assistant:

Estimate<double>
            bootstrap( double confidence_level,
                       double* first,
                       double* last,
                       sample const& resample,
                       double ( *estimator )( double const*, double const* ) ) {
                auto n_samples = last - first;

                double point = estimator( first, last );
                // Degenerate case with a single sample
                if ( n_samples == 1 )
                    return { point, point, point, confidence_level };

                sample jack = jackknife( estimator, first, last );
                double jack_mean =
                    mean( jack.data(), jack.data() + jack.size() );
                double sum_squares = 0, sum_cubes = 0;
                for ( double x : jack ) {
                    auto difference = jack_mean - x;
                    auto square = difference * difference;
                    auto cube = square * difference;
                    sum_squares += square;
                    sum_cubes += cube;
                }

                double accel = sum_cubes / ( 6 * std::pow( sum_squares, 1.5 ) );
                long n = static_cast<long>( resample.size() );
                double prob_n =
                    std::count_if( resample.begin(),
                                   resample.end(),
                                   [point]( double x ) { return x < point; } ) /
                    static_cast<double>( n );
                // degenerate case with uniform samples
                if ( Catch::Detail::directCompare( prob_n, 0. ) ) {
                    return { point, point, point, confidence_level };
                }

                double bias = normal_quantile( prob_n );
                double z1 = normal_quantile( ( 1. - confidence_level ) / 2. );

                auto cumn = [n]( double x ) -> long {
                    return std::lround( normal_cdf( x ) *
                                        static_cast<double>( n ) );
                };
                auto a = [bias, accel]( double b ) {
                    return bias + b / ( 1. - accel * b );
                };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a( b1 );
                double a2 = a( b2 );
                auto lo = static_cast<size_t>( (std::max)( cumn( a1 ), 0l ) );
                auto hi =
                    static_cast<size_t>( (std::min)( cumn( a2 ), n - 1 ) );

                return { point, resample[lo], resample[hi], confidence_level };
            }